

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O2

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  ushort uVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint tableLog;
  U32 tableSize;
  long lVar7;
  ulong uVar8;
  
  uVar1 = (ushort)*ctable;
  bVar2 = (byte)uVar1;
  lVar7 = 1;
  if (uVar1 != 0) {
    lVar7 = (long)(1 << (bVar2 - 1 & 0x1f));
  }
  sVar3 = 0xffffffffffffffff;
  if (max <= *(ushort *)((long)ctable + 2)) {
    uVar8 = 0;
    for (lVar4 = 0; (ulong)max + 1 != lVar4; lVar4 = lVar4 + 1) {
      iVar5 = (ctable[lVar7 + lVar4 * 2 + 2] >> 0x10) + 1;
      if ((ulong)count[lVar4] != 0) {
        uVar6 = iVar5 * 0x100 -
                (iVar5 * 0x1000000 +
                 (ctable[lVar7 + lVar4 * 2 + 2] + (1 << (bVar2 & 0x1f))) * -0x100 >> (bVar2 & 0x1f))
        ;
        if ((uint)uVar1 * 0x100 + 0x100 <= uVar6) {
          return 0xffffffffffffffff;
        }
        uVar8 = uVar8 + (ulong)uVar6 * (ulong)count[lVar4];
      }
    }
    sVar3 = uVar8 >> 8;
  }
  return sVar3;
}

Assistant:

MEM_STATIC U16 MEM_read16(const void* ptr) { return ((const unalign16*)ptr)->v; }